

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O3

void pstack::print_container<std::vector<unsigned_long,std::allocator<unsigned_long>>,char_const&>
               (ostream *os,long *container)

{
  long lVar1;
  size_t sVar2;
  char *__s;
  unsigned_long *field;
  long lVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[ ",2);
  lVar3 = *container;
  lVar1 = container[1];
  if (lVar3 != lVar1) {
    __s = "";
    do {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar2);
      std::ostream::_M_insert<unsigned_long>((ulong)os);
      lVar3 = lVar3 + 8;
      __s = ",\n";
    } while (lVar3 != lVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os," ]",2);
  return;
}

Assistant:

void print_container(std::ostream &os, const Container &container, Context &&ctx, std::false_type)
{
   os << "[ ";
   const char *sep = "";
   for (const auto &field : container) {
      os << sep << json(field, ctx);
      sep = ",\n";
   }
   os << " ]";
}